

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

int32_t utf8TextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                       UErrorCode *pErrorCode)

{
  char *pcVar1;
  byte bVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint8_t *s;
  int32_t length;
  UChar *pUVar10;
  int iVar11;
  UChar *pUVar12;
  bool bVar13;
  int32_t index;
  int32_t local_50;
  int32_t local_4c;
  UChar *local_48;
  ulong local_40;
  UText *local_38;
  
  length = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (destCapacity != 0 && dest == (UChar *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      length = 0;
    }
    else {
      local_40 = (ulong)ut->b;
      uVar5 = start;
      if ((long)local_40 < start) {
        uVar5 = local_40;
      }
      length = 0;
      iVar9 = (int)uVar5;
      if (start < 0) {
        iVar9 = 0;
      }
      if (limit <= (long)local_40) {
        local_40 = limit;
      }
      local_40 = local_40 & 0xffffffff;
      if (limit < 0) {
        local_40 = 0;
      }
      iVar11 = (int)local_40;
      if (iVar11 < iVar9) {
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        pvVar3 = ut->context;
        lVar6 = (long)iVar9;
        iVar8 = iVar9;
        if (lVar6 < ut->chunkNativeLimit) {
          iVar8 = iVar9 + -3;
          iVar7 = 0;
          do {
            pcVar1 = (char *)((long)pvVar3 + lVar6);
            if (-1 < *pcVar1) {
LAB_001bb790:
              iVar8 = iVar9 - iVar7;
              break;
            }
            bVar13 = lVar6 == 0;
            lVar6 = lVar6 + -1;
            if (((byte)(*pcVar1 + 0x3eU) < 0x33) || (bVar13)) goto LAB_001bb790;
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
        }
        lVar6 = (long)iVar11;
        if (lVar6 < ut->chunkNativeLimit) {
          iVar9 = 0;
          do {
            pcVar1 = (char *)((long)pvVar3 + lVar6);
            if (-1 < *pcVar1) {
LAB_001bb7d2:
              local_40 = (ulong)(uint)(iVar11 - iVar9);
              goto LAB_001bb7d5;
            }
            bVar13 = lVar6 == 0;
            lVar6 = lVar6 + -1;
            if (((byte)(*pcVar1 + 0x3eU) < 0x33) || (bVar13)) goto LAB_001bb7d2;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 3);
          local_40 = (ulong)(iVar11 - 3);
        }
LAB_001bb7d5:
        s = (uint8_t *)((long)pvVar3 + (long)iVar8);
        pUVar12 = dest + (uint)destCapacity;
        if (dest == (UChar *)0x0) {
          pUVar12 = (UChar *)0x0;
        }
        iVar11 = (int)local_40 - iVar8;
        local_50 = 0;
        iVar9 = 0;
        local_4c = destCapacity;
        local_48 = dest;
        local_38 = ut;
        if (dest < pUVar12 && (iVar11 != 0 && iVar8 <= (int)local_40)) {
          local_50 = 0;
          iVar9 = 0;
          pUVar10 = dest;
          do {
            iVar8 = local_50 + 1;
            bVar2 = s[local_50];
            uVar4 = (uint)(char)bVar2;
            local_50 = iVar8;
            if (((char)bVar2 < '\0') &&
               (uVar4 = utf8_nextCharSafeBody_63(s,&local_50,iVar11,(uint)bVar2,-3), 0xffff < uVar4)
               ) {
              dest = pUVar10 + 1;
              *pUVar10 = (short)(uVar4 >> 10) + L'ퟀ';
              if (pUVar12 <= dest) {
                iVar9 = 1;
                break;
              }
              pUVar10[1] = (ushort)uVar4 & 0x3ff | 0xdc00;
              dest = pUVar10 + 2;
            }
            else {
              *pUVar10 = (UChar)uVar4;
              dest = pUVar10 + 1;
            }
            if ((iVar11 <= local_50) || (pUVar10 = dest, pUVar12 <= dest)) break;
          } while( true );
        }
        if (local_50 < iVar11) {
          do {
            lVar6 = (long)local_50;
            if ((char)s[lVar6] < '\0') {
              local_50 = local_50 + 1;
              uVar4 = utf8_nextCharSafeBody_63(s,&local_50,iVar11,(uint)s[lVar6],-3);
              iVar9 = (iVar9 - (uint)(uVar4 < 0x10000)) + 2;
            }
            else {
              iVar9 = iVar9 + 1;
              local_50 = local_50 + 1;
            }
          } while (local_50 < iVar11);
        }
        length = (int)((ulong)((long)dest - (long)local_48) >> 1) + iVar9;
        u_terminateUChars_63(local_48,local_4c,length,pErrorCode);
        utf8TextAccess(local_38,(long)(int)local_40,'\x01');
      }
    }
  }
  return length;
}

Assistant:

static int32_t U_CALLCONV
utf8TextExtract(UText *ut,
                int64_t start, int64_t limit,
                UChar *dest, int32_t destCapacity,
                UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t  length  = ut->b;
    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);

    if(start32>limit32) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }


    // adjust the incoming indexes to land on code point boundaries if needed.
    //    adjust by no more than three, because that is the largest number of trail bytes
    //    in a well formed UTF8 character.
    const uint8_t *buf = (const uint8_t *)ut->context;
    int i;
    if (start32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[start32]) || U8_IS_LEAD(buf[start32]) || start32==0) {
                break;
            }
            start32--;
        }
    }

    if (limit32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[limit32]) || U8_IS_LEAD(buf[limit32]) || limit32==0) {
                break;
            }
            limit32--;
        }
    }

    // Do the actual extract.
    int32_t destLength=0;
    utext_strFromUTF8(dest, destCapacity, &destLength,
                    (const char *)ut->context+start32, limit32-start32,
                    pErrorCode);
    utf8TextAccess(ut, limit32, TRUE);
    return destLength;
}